

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<float>
          (DepthRangeAPI *this,vector<float,_std::allocator<float>_> *left,
          vector<float,_std::allocator<float>_> *right,GLchar *description,bool *out_result)

{
  float *pfVar1;
  ostringstream *this_00;
  float fVar2;
  pointer pfVar3;
  MessageBuilder *pMVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_1b0 [384];
  
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  for (uVar5 = 0;
      pfVar3 = (left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar3 >> 2);
      uVar5 = uVar5 + 1) {
    fVar2 = *(float *)((long)pfVar3 + lVar6);
    pfVar1 = (float *)((long)(right->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Test case: ");
      std::operator<<((ostream *)this_00,description);
      std::operator<<((ostream *)this_00," Invalid values [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"] ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (float *)((long)(left->super__Vector_base<float,_std::allocator<float>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar6));
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)((long)(right->
                                                 super__Vector_base<float,_std::allocator<float>_>).
                                                 _M_impl.super__Vector_impl_data._M_start + lVar6));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      *out_result = false;
    }
    lVar6 = lVar6 + 4;
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}